

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

pair<unsigned_long,_llvm::dwarf::Tag> __thiscall
llvm::AppleAcceleratorTable::readAtoms(AppleAcceleratorTable *this,uint64_t *HashDataOffset)

{
  short sVar1;
  pair<unsigned_long,_llvm::dwarf::Tag> pVar2;
  unsigned_long *puVar3;
  long lVar4;
  short *psVar5;
  Optional<unsigned_long> OVar6;
  undefined1 local_90 [8];
  DWARFFormValue FormValue;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 local_58;
  undefined1 local_50;
  unsigned_long local_48;
  ulong local_40;
  FormParams local_34;
  
  local_34.AddrSize = '\0';
  local_34.Format = DWARF32;
  local_34.Version = (this->Hdr).Version;
  psVar5 = (short *)(this->HdrData).Atoms.
                    super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                    super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                    .
                    super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                    .super_SmallVectorBase.BeginX;
  local_48 = 0xffffffff;
  local_40 = 0;
  FormValue.C = (DWARFContext *)HashDataOffset;
  for (lVar4 = (ulong)(this->HdrData).Atoms.
                      super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
                      super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>
                      .
                      super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                      .super_SmallVectorBase.Size << 2; lVar4 != 0; lVar4 = lVar4 + -4) {
    sVar1 = *psVar5;
    local_90._0_2_ = psVar5[1];
    FormValue.Form = 0;
    FormValue._2_6_ = 0;
    FormValue.Value.field_0.uval = 0;
    FormValue.Value.SectionIndex = 0;
    FormValue.U = (DWARFUnit *)0x0;
    DWARFFormValue::extractValue
              ((DWARFFormValue *)local_90,&(this->super_DWARFAcceleratorTable).AccelSection,
               (uint64_t *)FormValue.C,local_34,(DWARFContext *)0x0,(DWARFUnit *)0x0);
    if (sVar1 == 3) {
      OVar6 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_90);
      local_58 = OVar6.Storage.field_0;
      local_50 = OVar6.Storage.hasVal;
      puVar3 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&local_58);
      local_40 = (ulong)(ushort)*puVar3;
    }
    else if (sVar1 == 1) {
      OVar6 = DWARFFormValue::getAsUnsignedConstant((DWARFFormValue *)local_90);
      local_58 = OVar6.Storage.field_0;
      local_50 = OVar6.Storage.hasVal;
      puVar3 = optional_detail::OptionalStorage<unsigned_long,_true>::getValue
                         ((OptionalStorage<unsigned_long,_true> *)&local_58);
      local_48 = *puVar3;
    }
    psVar5 = psVar5 + 2;
  }
  pVar2._8_8_ = local_40;
  pVar2.first = local_48;
  return pVar2;
}

Assistant:

std::pair<uint64_t, dwarf::Tag>
AppleAcceleratorTable::readAtoms(uint64_t *HashDataOffset) {
  uint64_t DieOffset = dwarf::DW_INVALID_OFFSET;
  dwarf::Tag DieTag = dwarf::DW_TAG_null;
  dwarf::FormParams FormParams = {Hdr.Version, 0, dwarf::DwarfFormat::DWARF32};

  for (auto Atom : getAtomsDesc()) {
    DWARFFormValue FormValue(Atom.second);
    FormValue.extractValue(AccelSection, HashDataOffset, FormParams);
    switch (Atom.first) {
    case dwarf::DW_ATOM_die_offset:
      DieOffset = *FormValue.getAsUnsignedConstant();
      break;
    case dwarf::DW_ATOM_die_tag:
      DieTag = (dwarf::Tag)*FormValue.getAsUnsignedConstant();
      break;
    default:
      break;
    }
  }
  return {DieOffset, DieTag};
}